

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O3

int32_t icu_63::MeasureUnit::getAvailable
                  (MeasureUnit *dest,int32_t destCapacity,UErrorCode *errorCode)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if (destCapacity < 0x1b9) {
    *errorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  else {
    lVar3 = 0;
    iVar4 = 0;
    iVar2 = 0;
    do {
      iVar1 = *(int *)(&DAT_002f5ed4 + lVar3 * 4);
      if (iVar2 < iVar1) {
        pcVar6 = dest[iVar4].fCurrency;
        iVar5 = 0;
        do {
          *(int32_t *)(pcVar6 + -8) = (int32_t)lVar3;
          *(int *)(pcVar6 + -4) = iVar5;
          *pcVar6 = '\0';
          iVar5 = iVar5 + 1;
          pcVar6 = pcVar6 + 0x18;
        } while (iVar1 - iVar2 != iVar5);
        iVar4 = iVar4 + iVar5;
      }
      lVar3 = lVar3 + 1;
      iVar2 = iVar1;
    } while (lVar3 != 0x14);
  }
  return 0x1b9;
}

Assistant:

int32_t MeasureUnit::getAvailable(
        MeasureUnit *dest,
        int32_t destCapacity,
        UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return 0;
    }
    if (destCapacity < UPRV_LENGTHOF(gSubTypes)) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return UPRV_LENGTHOF(gSubTypes);
    }
    int32_t idx = 0;
    for (int32_t typeIdx = 0; typeIdx < UPRV_LENGTHOF(gTypes); ++typeIdx) {
        int32_t len = gOffsets[typeIdx + 1] - gOffsets[typeIdx];
        for (int32_t subTypeIdx = 0; subTypeIdx < len; ++subTypeIdx) {
            dest[idx].setTo(typeIdx, subTypeIdx);
            ++idx;
        }
    }
    U_ASSERT(idx == UPRV_LENGTHOF(gSubTypes));
    return UPRV_LENGTHOF(gSubTypes);
}